

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::matrixMetric(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *__return_storage_ptr__,
              SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int type)

{
  uint *puVar1;
  undefined1 (*pauVar2) [16];
  pointer pnVar3;
  undefined1 auVar4 [16];
  int iVar5;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar6;
  long lVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_1b8;
  cpp_dec_float<50U,_int,_void> local_178;
  cpp_dec_float<50U,_int,_void> local_138;
  cpp_dec_float<50U,_int,_void> local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8 [2];
  undefined8 uStack_a0;
  uint local_98 [4];
  uint local_88 [2];
  uint auStack_80 [2];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined8 local_68;
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems._24_5_ = 0;
  local_178.data._M_elems[7]._1_3_ = 0;
  local_178.data._M_elems._32_5_ = 0;
  local_178.data._M_elems[9]._1_3_ = 0;
  local_178.exp = 0;
  local_178.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_178,0.0);
  iVar5 = (*(this->
            super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SLinSolver[4])(this);
  local_c0 = __return_storage_ptr__;
  if (iVar5 == 0) {
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 10;
    (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,1.0);
  }
  else {
    if (type == 2) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_178,1.0);
      iVar5 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (0 < iVar5) {
        lVar6 = 0;
        lVar7 = 0;
        do {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_178,
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)(((this->
                              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).diag.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar6));
          lVar7 = lVar7 + 1;
          iVar5 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar6 = lVar6 + 0x38;
        } while (lVar7 < iVar5);
      }
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 10;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems._32_5_ = 0;
      local_138.data._M_elems[9]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_f8,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_138,&local_f8,&local_178);
      local_178.data._M_elems[0] = local_138.data._M_elems[0];
      local_178.data._M_elems[1] = local_138.data._M_elems[1];
      local_178.data._M_elems[2] = local_138.data._M_elems[2];
      local_178.data._M_elems[3] = local_138.data._M_elems[3];
      local_178.data._M_elems[4] = local_138.data._M_elems[4];
      local_178.data._M_elems[5] = local_138.data._M_elems[5];
      local_178.data._M_elems._24_5_ =
           SUB85(CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]),0);
      local_178.data._M_elems[7]._1_3_ = (undefined3)(local_138.data._M_elems[7] >> 8);
      local_178.data._M_elems._32_5_ = local_138.data._M_elems._32_5_;
      local_178.data._M_elems[9]._1_3_ = local_138.data._M_elems[9]._1_3_;
      local_178.exp = local_138.exp;
      local_178.neg = local_138.neg;
      local_178.fpclass = local_138.fpclass;
      local_178.prec_elem = local_138.prec_elem;
    }
    else if (type == 1) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_178,0.0);
      iVar5 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (0 < iVar5) {
        lVar6 = 0;
        lVar7 = 0;
        do {
          pnVar3 = (this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).diag.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_138.fpclass = cpp_dec_float_finite;
          local_138.prec_elem = 10;
          local_138.data._M_elems[0] = 0;
          local_138.data._M_elems[1] = 0;
          local_138.data._M_elems[2] = 0;
          local_138.data._M_elems[3] = 0;
          local_138.data._M_elems[4] = 0;
          local_138.data._M_elems[5] = 0;
          local_138.data._M_elems[6] = 0;
          local_138.data._M_elems[7] = 0;
          local_138.data._M_elems._32_5_ = 0;
          local_138.data._M_elems[9]._1_3_ = 0;
          local_138.exp = 0;
          local_138.neg = false;
          local_f8.fpclass = cpp_dec_float_finite;
          local_f8.prec_elem = 10;
          local_f8.data._M_elems[0] = 0;
          local_f8.data._M_elems[1] = 0;
          local_f8.data._M_elems[2] = 0;
          local_f8.data._M_elems[3] = 0;
          local_f8.data._M_elems[4] = 0;
          local_f8.data._M_elems[5] = 0;
          local_f8.data._M_elems._24_5_ = 0;
          local_f8.data._M_elems[7]._1_3_ = 0;
          local_f8.data._M_elems._32_5_ = 0;
          local_f8.data._M_elems[9]._1_3_ = 0;
          local_f8.exp = 0;
          local_f8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_f8,1.0);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_138,&local_f8,
                     (cpp_dec_float<50U,_int,_void> *)
                     ((long)(pnVar3->m_backend).data._M_elems + lVar6));
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_178,&local_138);
          lVar7 = lVar7 + 1;
          iVar5 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar6 = lVar6 + 0x38;
        } while (lVar7 < iVar5);
      }
    }
    else if (type == 0) {
      pnVar3 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).diag.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_38 = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 8);
      local_f8.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
      local_f8.data._M_elems._8_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 2);
      local_f8.data._M_elems._16_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 4);
      uStack_40 = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 6);
      local_f8.exp = (pnVar3->m_backend).exp;
      local_f8.neg = (pnVar3->m_backend).neg;
      local_f8.data._M_elems._24_5_ = SUB85(uStack_40,0);
      local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_40 >> 0x28);
      local_f8.data._M_elems._32_5_ = SUB85(local_38,0);
      local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_38 >> 0x28);
      local_f8.fpclass = (pnVar3->m_backend).fpclass;
      local_f8.prec_elem = (pnVar3->m_backend).prec_elem;
      if ((local_f8.neg == true) &&
         (local_f8.fpclass != cpp_dec_float_finite || local_f8.data._M_elems[0] != 0)) {
        local_f8.neg = false;
      }
      local_138.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
      local_138.data._M_elems._8_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 2);
      puVar1 = (pnVar3->m_backend).data._M_elems + 4;
      local_78 = *puVar1;
      uStack_74 = (pnVar3->m_backend).data._M_elems[5];
      local_138.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_138.data._M_elems[6] = (pnVar3->m_backend).data._M_elems[6];
      local_138.data._M_elems[7] = (pnVar3->m_backend).data._M_elems[7];
      local_68 = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 8);
      local_138.exp = (pnVar3->m_backend).exp;
      local_138.neg = (pnVar3->m_backend).neg;
      local_138.data._M_elems._32_5_ = SUB85(local_68,0);
      local_138.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_68 >> 0x28);
      local_138.fpclass = (pnVar3->m_backend).fpclass;
      local_138.prec_elem = (pnVar3->m_backend).prec_elem;
      if ((local_138.neg == true) &&
         (local_138.fpclass != cpp_dec_float_finite || local_138.data._M_elems[0] != 0)) {
        local_138.neg = false;
      }
      local_88 = (uint  [2])local_138.data._M_elems._0_8_;
      auStack_80 = (uint  [2])local_138.data._M_elems._8_8_;
      uStack_70 = local_138.data._M_elems[6];
      uStack_6c = local_138.data._M_elems[7];
      local_58 = (uint  [2])local_f8.data._M_elems._0_8_;
      auStack_50 = (uint  [2])local_f8.data._M_elems._8_8_;
      local_48 = (uint  [2])local_f8.data._M_elems._16_8_;
      iVar5 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (1 < iVar5) {
        lVar6 = 1;
        lVar7 = 0x68;
        do {
          pnVar3 = (this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).diag.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_1b8.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar7 + -0x10);
          pauVar2 = (undefined1 (*) [16])((long)(pnVar3->m_backend).data._M_elems + lVar7 + -0x30);
          local_b8 = *(undefined8 *)*pauVar2;
          uStack_b0 = *(undefined8 *)(*pauVar2 + 8);
          auVar4 = *pauVar2;
          puVar1 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar7 + -0x20);
          local_1b8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          uStack_a0 = *(undefined8 *)(puVar1 + 2);
          local_1b8.exp = *(int *)((long)(pnVar3->m_backend).data._M_elems + lVar7 + -8);
          local_1b8.neg = *(bool *)((long)(pnVar3->m_backend).data._M_elems + lVar7 + -4);
          local_1b8._48_8_ = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar7);
          local_1b8.data._M_elems._24_5_ = SUB85(uStack_a0,0);
          local_1b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_a0 >> 0x28);
          if ((local_1b8.neg == true) &&
             (local_1b8.data._M_elems[0] = (uint)local_b8,
             local_1b8.data._M_elems[0] != 0 || local_1b8.fpclass != cpp_dec_float_finite)) {
            local_1b8.neg = false;
          }
          local_1b8.data._M_elems._0_16_ = auVar4;
          local_a8 = (uint  [2])local_1b8.data._M_elems._16_8_;
          local_98._0_8_ = local_1b8.data._M_elems._32_8_;
          if ((local_1b8.fpclass == cpp_dec_float_NaN) || (local_f8.fpclass == cpp_dec_float_NaN)) {
LAB_0029e136:
            if ((local_1b8.fpclass != cpp_dec_float_NaN) && (local_138.fpclass != cpp_dec_float_NaN)
               ) {
              v = &local_138;
              iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_1b8,v);
              if (0 < iVar5) goto LAB_0029e167;
            }
          }
          else {
            v = &local_f8;
            iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_1b8,v);
            if (-1 < iVar5) goto LAB_0029e136;
LAB_0029e167:
            *(undefined8 *)((v->data)._M_elems + 8) = local_1b8.data._M_elems._32_8_;
            *(undefined8 *)((v->data)._M_elems + 4) = local_1b8.data._M_elems._16_8_;
            *(ulong *)((v->data)._M_elems + 6) =
                 CONCAT35(local_1b8.data._M_elems[7]._1_3_,local_1b8.data._M_elems._24_5_);
            *(undefined8 *)(v->data)._M_elems = local_1b8.data._M_elems._0_8_;
            *(undefined8 *)((v->data)._M_elems + 2) = local_1b8.data._M_elems._8_8_;
            v->exp = local_1b8.exp;
            v->neg = local_1b8.neg;
            v->fpclass = local_1b8.fpclass;
            v->prec_elem = local_1b8.prec_elem;
          }
          lVar6 = lVar6 + 1;
          iVar5 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar7 = lVar7 + 0x38;
        } while (lVar6 < iVar5);
      }
      local_1b8.fpclass = cpp_dec_float_finite;
      local_1b8.prec_elem = 10;
      local_1b8.data._M_elems[0] = 0;
      local_1b8.data._M_elems[1] = 0;
      local_1b8.data._M_elems[2] = 0;
      local_1b8.data._M_elems[3] = 0;
      local_1b8.data._M_elems[4] = 0;
      local_1b8.data._M_elems[5] = 0;
      local_1b8.data._M_elems._24_5_ = 0;
      local_1b8.data._M_elems[7]._1_3_ = 0;
      local_1b8.data._M_elems[8] = 0;
      local_1b8.data._M_elems[9] = 0;
      local_1b8.exp = 0;
      local_1b8.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_1b8,&local_138,&local_f8);
      local_178.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
      local_178.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
      local_178.data._M_elems[4] = local_1b8.data._M_elems[4];
      local_178.data._M_elems[5] = local_1b8.data._M_elems[5];
      local_178.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
      local_178.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
      local_178.data._M_elems[0] = local_1b8.data._M_elems[0];
      local_178.data._M_elems[1] = local_1b8.data._M_elems[1];
      local_178.data._M_elems[2] = local_1b8.data._M_elems[2];
      local_178.data._M_elems[3] = local_1b8.data._M_elems[3];
      local_178.exp = local_1b8.exp;
      local_178.neg = local_1b8.neg;
      local_178.fpclass = local_1b8.fpclass;
      local_178.prec_elem = local_1b8.prec_elem;
    }
    *(ulong *)((local_c0->m_backend).data._M_elems + 8) =
         CONCAT35(local_178.data._M_elems[9]._1_3_,local_178.data._M_elems._32_5_);
    *(undefined8 *)((local_c0->m_backend).data._M_elems + 4) = local_178.data._M_elems._16_8_;
    *(ulong *)((local_c0->m_backend).data._M_elems + 6) =
         CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
    *(undefined8 *)(local_c0->m_backend).data._M_elems = local_178.data._M_elems._0_8_;
    *(undefined8 *)((local_c0->m_backend).data._M_elems + 2) = local_178.data._M_elems._8_8_;
    (local_c0->m_backend).exp = local_178.exp;
    (local_c0->m_backend).neg = local_178.neg;
    (local_c0->m_backend).fpclass = local_178.fpclass;
    (local_c0->m_backend).prec_elem = local_178.prec_elem;
  }
  return local_c0;
}

Assistant:

R SLUFactor<R>::matrixMetric(int type) const
{
   R result = 0.0;

   // catch corner case of empty matrix
   if(dim() == 0)
      return 1.0;

   switch(type)
   {
   // compute condition estimate by ratio of max/min of elements on the diagonal
   case 0:
   {
      R mindiag = spxAbs(this->diag[0]);
      R maxdiag = spxAbs(this->diag[0]);

      for(int i = 1; i < dim(); ++i)
      {
         R absdiag = spxAbs(this->diag[i]);

         if(absdiag < mindiag)
            mindiag = absdiag;
         else if(absdiag > maxdiag)
            maxdiag = absdiag;
      }

      result = maxdiag / mindiag;
      break;
   }

   // compute sum of inverses of all elements on the diagonal
   case 1:
      result = 0.0;

      for(int i = 0; i < dim(); ++i)
         result += 1.0 / this->diag[i];

      break;

   // compute determinant (product of all diagonal elements of U)
   case 2:
      result = 1.0;

      for(int i = 0; i < dim(); ++i)
         result *= this->diag[i];

      result = 1.0 / result;
      break;
   }

   return result;
}